

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

uint ZSTD_NbCommonBytes(size_t val)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t val_local;
  
  uVar3 = MEM_isLittleEndian();
  uVar4 = (uint)val;
  if (uVar3 == 0) {
    uVar3 = MEM_64bits();
    if (uVar3 == 0) {
      uVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      val_local._4_4_ = (int)(uVar3 ^ 0x1f) >> 3;
    }
    else {
      lVar1 = 0x3f;
      if (val != 0) {
        for (; val >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      val_local._4_4_ = (int)((uint)lVar1 ^ 0x3f) >> 3;
    }
  }
  else {
    uVar3 = MEM_64bits();
    if (uVar3 == 0) {
      iVar2 = 0;
      for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        iVar2 = iVar2 + 1;
      }
      val_local._4_4_ = iVar2 >> 3;
    }
    else {
      iVar2 = 0;
      for (; (val & 1) == 0; val = val >> 1 | 0x8000000000000000) {
        iVar2 = iVar2 + 1;
      }
      val_local._4_4_ = iVar2 >> 3;
    }
  }
  return val_local._4_4_;
}

Assistant:

static unsigned ZSTD_NbCommonBytes (size_t val)
{
    if (MEM_isLittleEndian()) {
        if (MEM_64bits()) {
#       if defined(_MSC_VER) && defined(_WIN64)
#           if STATIC_BMI2
                return _tzcnt_u64(val) >> 3;
#           else
                unsigned long r = 0;
                return _BitScanForward64( &r, (U64)val ) ? (unsigned)(r >> 3) : 0;
#           endif
#       elif defined(__GNUC__) && (__GNUC__ >= 4)
            return (__builtin_ctzll((U64)val) >> 3);
#       else
            static const int DeBruijnBytePos[64] = { 0, 0, 0, 0, 0, 1, 1, 2,
                                                     0, 3, 1, 3, 1, 4, 2, 7,
                                                     0, 2, 3, 6, 1, 5, 3, 5,
                                                     1, 3, 4, 4, 2, 5, 6, 7,
                                                     7, 0, 1, 2, 3, 3, 4, 6,
                                                     2, 6, 5, 5, 3, 4, 5, 6,
                                                     7, 1, 2, 4, 6, 4, 4, 5,
                                                     7, 2, 6, 5, 7, 6, 7, 7 };
            return DeBruijnBytePos[((U64)((val & -(long long)val) * 0x0218A392CDABBD3FULL)) >> 58];
#       endif
        } else { /* 32 bits */
#       if defined(_MSC_VER)
            unsigned long r=0;
            return _BitScanForward( &r, (U32)val ) ? (unsigned)(r >> 3) : 0;
#       elif defined(__GNUC__) && (__GNUC__ >= 3)
            return (__builtin_ctz((U32)val) >> 3);
#       else
            static const int DeBruijnBytePos[32] = { 0, 0, 3, 0, 3, 1, 3, 0,
                                                     3, 2, 2, 1, 3, 2, 0, 1,
                                                     3, 3, 1, 2, 2, 2, 2, 0,
                                                     3, 1, 2, 0, 1, 0, 1, 1 };
            return DeBruijnBytePos[((U32)((val & -(S32)val) * 0x077CB531U)) >> 27];
#       endif
        }
    } else {  /* Big Endian CPU */
        if (MEM_64bits()) {
#       if defined(_MSC_VER) && defined(_WIN64)
#           if STATIC_BMI2
			    return _lzcnt_u64(val) >> 3;
#           else
			    unsigned long r = 0;
			    return _BitScanReverse64(&r, (U64)val) ? (unsigned)(r >> 3) : 0;
#           endif
#       elif defined(__GNUC__) && (__GNUC__ >= 4)
            return (__builtin_clzll(val) >> 3);
#       else
            unsigned r;
            const unsigned n32 = sizeof(size_t)*4;   /* calculate this way due to compiler complaining in 32-bits mode */
            if (!(val>>n32)) { r=4; } else { r=0; val>>=n32; }
            if (!(val>>16)) { r+=2; val>>=8; } else { val>>=24; }
            r += (!val);
            return r;
#       endif
        } else { /* 32 bits */
#       if defined(_MSC_VER)
            unsigned long r = 0;
            return _BitScanReverse( &r, (unsigned long)val ) ? (unsigned)(r >> 3) : 0;
#       elif defined(__GNUC__) && (__GNUC__ >= 3)
            return (__builtin_clz((U32)val) >> 3);
#       else
            unsigned r;
            if (!(val>>16)) { r=2; val>>=8; } else { r=0; val>>=24; }
            r += (!val);
            return r;
#       endif
    }   }
}